

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.hpp
# Opt level: O2

void __thiscall Omega_h::Graph::~Graph(Graph *this)

{
  Write<int>::~Write(&(this->ab2b).write_);
  Write<int>::~Write((Write<int> *)this);
  return;
}

Assistant:

OMEGA_H_INLINE Graph() {}